

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.h
# Opt level: O0

__type * __thiscall
NS::
wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
          (NS *this,char *first,char *rest,char *rest_1,char *rest_2,char *rest_3,char *rest_4,
          char *rest_5,char *rest_6,char *rest_7,char *rest_8,char *rest_9,char *rest_10,
          char *rest_11,char *rest_12,char *rest_13,char *rest_14,char *rest_15,char *rest_16,
          char *rest_17,char *rest_18,char *rest_19,char *rest_20,char *rest_21,char *rest_22,
          char *rest_23,char *rest_24,char *rest_25)

{
  char *unaff_RBP;
  __type *in_RDI;
  NS *in_R8;
  char *in_R9;
  char *unaff_R15;
  char *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
  *in_stack_00000018;
  tuple<N_*> *in_stack_00000020;
  char *in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  char *in_stack_00000040;
  char *in_stack_00000048;
  char *in_stack_00000050;
  char *in_stack_00000058;
  char *in_stack_00000060;
  char *in_stack_00000068;
  char *in_stack_00000070;
  char *in_stack_00000078;
  char *in_stack_00000080;
  char *in_stack_00000088;
  char *in_stack_00000090;
  char *in_stack_00000098;
  char *in_stack_fffffffffffffdb0;
  NS *in_stack_fffffffffffffdb8;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  
  wrap<char_const*>(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (in_R8,in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,
             in_stack_00000010,(char *)in_stack_00000018,(char *)in_stack_00000020,in_stack_00000028
             ,in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048,
             in_stack_00000050,in_stack_00000058,in_stack_00000060,in_stack_00000068,
             in_stack_00000070,in_stack_00000078,in_stack_00000080,in_stack_00000088,
             in_stack_00000090,in_stack_00000098);
  std::
  tuple_cat<std::tuple<N*>,std::tuple<N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>,void>
            (in_stack_00000020,in_stack_00000018);
  return in_RDI;
}

Assistant:

auto wrap(DataType first, Args  ... rest) {
        return std::tuple_cat(wrap(first), wrap(rest...));
    }